

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

void lws_cmdline_option_handle_builtin(int argc,char **argv,lws_context_creation_info *info)

{
  int iVar1;
  int iVar2;
  char *__nptr;
  int local_34;
  int logs;
  int m;
  int n;
  char *p;
  lws_context_creation_info *info_local;
  char **argv_local;
  int argc_local;
  
  local_34 = 0x407;
  for (logs = 0; logs < 3; logs = logs + 1) {
    __nptr = lws_cmdline_option(argc,argv,builtins[logs]);
    iVar1 = local_34;
    if ((__nptr != (char *)0x0) && (iVar2 = atoi(__nptr), iVar1 = iVar2, logs != 0)) {
      if (logs == 1) {
        info->udp_loss_sim_tx_pc = (uint8_t)iVar2;
        iVar1 = local_34;
      }
      else {
        iVar1 = local_34;
        if (logs == 2) {
          info->udp_loss_sim_rx_pc = (uint8_t)iVar2;
        }
      }
    }
    local_34 = iVar1;
  }
  lws_set_log_level(local_34,(_func_void_int_char_ptr *)0x0);
  return;
}

Assistant:

void
lws_cmdline_option_handle_builtin(int argc, const char **argv,
				  struct lws_context_creation_info *info)
{
	const char *p;
	int n, m, logs = LLL_USER | LLL_ERR | LLL_WARN | LLL_NOTICE;

	for (n = 0; n < (int)LWS_ARRAY_SIZE(builtins); n++) {
		p = lws_cmdline_option(argc, argv, builtins[n]);
		if (!p)
			continue;

		m = atoi(p);

		switch (n) {
		case 0:
			logs = m;
			break;
		case 1:
			info->udp_loss_sim_tx_pc = m;
			break;
		case 2:
			info->udp_loss_sim_rx_pc = m;
			break;
		}
	}

	lws_set_log_level(logs, NULL);
}